

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalEmptyResult::Deserialize(LogicalEmptyResult *this,Deserializer *deserializer)

{
  LogicalEmptyResult *this_00;
  pointer pLVar1;
  _Head_base<0UL,_duckdb::LogicalEmptyResult_*,_false> local_20;
  
  this_00 = (LogicalEmptyResult *)operator_new(0x98);
  LogicalEmptyResult(this_00);
  local_20._M_head_impl = this_00;
  pLVar1 = unique_ptr<duckdb::LogicalEmptyResult,_std::default_delete<duckdb::LogicalEmptyResult>,_true>
           ::operator->((unique_ptr<duckdb::LogicalEmptyResult,_std::default_delete<duckdb::LogicalEmptyResult>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (deserializer,200,"return_types",&pLVar1->return_types);
  pLVar1 = unique_ptr<duckdb::LogicalEmptyResult,_std::default_delete<duckdb::LogicalEmptyResult>,_true>
           ::operator->((unique_ptr<duckdb::LogicalEmptyResult,_std::default_delete<duckdb::LogicalEmptyResult>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::ColumnBinding,true>>
            (deserializer,0xc9,"bindings",&pLVar1->bindings);
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalEmptyResult::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<LogicalEmptyResult>(new LogicalEmptyResult());
	deserializer.ReadPropertyWithDefault<vector<LogicalType>>(200, "return_types", result->return_types);
	deserializer.ReadPropertyWithDefault<vector<ColumnBinding>>(201, "bindings", result->bindings);
	return std::move(result);
}